

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void check_config(vector_t *cfg)

{
  pointer ptVar1;
  pointer piVar2;
  code *pcVar3;
  char extraout_AL;
  bool bVar4;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  char extraout_AL_04;
  char extraout_AL_05;
  char extraout_AL_06;
  char extraout_AL_07;
  char extraout_AL_08;
  char extraout_AL_09;
  char extraout_AL_10;
  char extraout_AL_11;
  char extraout_AL_12;
  char extraout_AL_13;
  char extraout_AL_14;
  char extraout_AL_15;
  char extraout_AL_16;
  long lVar5;
  pointer ptVar6;
  ulong uVar7;
  undefined8 uVar8;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  double __x_07;
  double __x_08;
  double __x_09;
  double __x_10;
  double __x_11;
  double __x_12;
  double __x_13;
  double __x_14;
  double __x_15;
  double __x_16;
  ResultBuilder DOCTEST_RB;
  ExpressionDecomposer local_d0;
  bool local_cc [4];
  Result local_c8;
  ResultBuilder local_a8;
  Expression_lhs<const_QString_&> local_30;
  
  doctest::detail::ResultBuilder::ResultBuilder
            (&local_a8,DT_REQUIRE,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
             ,0x51,"cfg.vector().size() == 1","","");
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
  local_30.lhs = (QString *)
                 (((long)(cfg->m_vector).
                         super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(cfg->m_vector).
                         super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
                         super__Vector_impl_data._M_start >> 5) * 0x6db6db6db6db6db7);
  local_30.m_at = local_d0.m_at;
  local_cc[0] = true;
  local_cc[1] = false;
  local_cc[2] = false;
  local_cc[3] = false;
  doctest::detail::Expression_lhs<unsigned_long_const>::operator==
            (&local_c8,(Expression_lhs<unsigned_long_const> *)&local_30,(int *)local_cc);
  doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
  local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
  doctest::String::~String(&local_c8.m_decomp);
  doctest::detail::ResultBuilder::log(&local_a8,__x);
  if (extraout_AL != '\0') {
    pcVar3 = (code *)swi(3);
    (*pcVar3)();
    return;
  }
  if (local_a8.super_AssertData.m_failed == true) {
    bVar4 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
    if (bVar4) goto LAB_00110a30;
  }
  doctest::String::~String(&local_a8.super_AssertData.m_decomp);
  doctest::String::~String(&local_a8.super_AssertData.m_exception);
  doctest::detail::ResultBuilder::ResultBuilder
            (&local_a8,DT_REQUIRE,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
             ,0x52,"cfg.vector().at( 0 ).string_field() == \"one\"","","");
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
  ptVar6 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
      super__Vector_impl_data._M_finish == ptVar6) {
    lVar5 = std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0
                       ,0);
LAB_001107f3:
    lVar5 = std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0
                       ,(lVar5 >> 5) * 0x6db6db6db6db6db7);
LAB_00110815:
    lVar5 = std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0
                       ,(lVar5 >> 5) * 0x6db6db6db6db6db7);
LAB_00110837:
    lVar5 = (lVar5 >> 5) * 0x6db6db6db6db6db7;
LAB_0011084d:
    lVar5 = std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0
                       ,lVar5);
LAB_0011085d:
    uVar7 = (lVar5 >> 5) * 0x6db6db6db6db6db7;
    uVar8 = 0;
LAB_00110878:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8,
               uVar7);
LAB_00110886:
    lVar5 = (long)ptVar6 >> 5;
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
               lVar5 * 0x6db6db6db6db6db7);
LAB_001108a8:
    lVar5 = lVar5 >> 5;
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
               lVar5 * 0x6db6db6db6db6db7);
LAB_001108ca:
    lVar5 = lVar5 >> 5;
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
               lVar5 * 0x6db6db6db6db6db7);
LAB_001108ec:
    lVar5 = lVar5 >> 5;
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
               lVar5 * 0x6db6db6db6db6db7);
LAB_0011090e:
    lVar5 = lVar5 >> 5;
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
               lVar5 * 0x6db6db6db6db6db7);
LAB_00110930:
    ptVar6 = (pointer)(lVar5 >> 5);
    lVar5 = std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0
                       ,(long)ptVar6 * 0x6db6db6db6db6db7);
LAB_00110952:
    lVar5 = std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0
                       ,(lVar5 >> 5) * 0x6db6db6db6db6db7);
LAB_00110974:
    lVar5 = std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0
                       ,(lVar5 >> 5) * 0x6db6db6db6db6db7);
LAB_00110996:
    lVar5 = (lVar5 >> 5) * 0x6db6db6db6db6db7;
LAB_001109ac:
    lVar5 = std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0
                       ,lVar5);
LAB_001109bc:
    uVar7 = (lVar5 >> 5) * 0x6db6db6db6db6db7;
    uVar8 = 0;
LAB_001109d7:
    lVar5 = std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar8,uVar7);
LAB_001109e5:
    uVar7 = (lVar5 >> 5) * 0x6db6db6db6db6db7;
    uVar8 = 0;
LAB_00110a00:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8,
               uVar7);
  }
  else {
    local_30.m_at = local_d0.m_at;
    local_30.lhs = &ptVar6->m_string_field;
    doctest::detail::Expression_lhs<const_QString_&>::operator==<char[4],_nullptr>
              (&local_c8,&local_30,(char (*) [4])"one");
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_00);
    if (extraout_AL_00 != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar4 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar4) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x53,"cfg.vector().at( 0 ).no_value_field() == true","","");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar6 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = (long)(cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ptVar6;
    if (lVar5 == 0) goto LAB_001107f3;
    local_30.lhs = (QString *)((ulong)local_d0.m_at << 0x20 | (ulong)ptVar6->m_no_value_field);
    local_cc[0] = true;
    doctest::detail::Expression_lhs<bool_const>::operator==
              (&local_c8,(Expression_lhs<bool_const> *)&local_30,local_cc);
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_01);
    if (extraout_AL_01 != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar4 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar4) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x54,"cfg.vector().at( 0 ).int_field().size() == 2","","");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar6 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = (long)(cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ptVar6;
    if (lVar5 == 0) goto LAB_00110815;
    local_30.lhs = (QString *)
                   ((long)(ptVar6->m_int_field).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(ptVar6->m_int_field).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 2);
    local_30.m_at = local_d0.m_at;
    local_cc[0] = true;
    local_cc[1] = false;
    local_cc[2] = false;
    local_cc[3] = false;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              (&local_c8,(Expression_lhs<unsigned_long_const> *)&local_30,(int *)local_cc);
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_02);
    if (extraout_AL_02 != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar4 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar4) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x55,"cfg.vector().at( 0 ).int_field().at( 0 ) == 100","","");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar6 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = (long)(cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ptVar6;
    if (lVar5 == 0) goto LAB_00110837;
    ptVar1 = (pointer)(ptVar6->m_int_field).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
    if ((pointer)(ptVar6->m_int_field).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish == ptVar1) {
      lVar5 = 0;
      goto LAB_0011084d;
    }
    local_30.m_at = local_d0.m_at;
    local_cc[0] = true;
    local_cc[1] = false;
    local_cc[2] = false;
    local_cc[3] = false;
    local_30.lhs = (QString *)ptVar1;
    doctest::detail::Expression_lhs<int_const&>::operator==
              (&local_c8,(Expression_lhs<int_const&> *)&local_30,(int *)local_cc);
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_03);
    if (extraout_AL_03 != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar4 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar4) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x56,"cfg.vector().at( 0 ).int_field().at( 1 ) == 200","","");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar6 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = (long)(cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ptVar6;
    if (lVar5 == 0) goto LAB_0011085d;
    piVar2 = (ptVar6->m_int_field).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (long)(ptVar6->m_int_field).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
    if (uVar7 < 2) {
      uVar8 = 1;
      goto LAB_00110878;
    }
    local_30.lhs = (QString *)(piVar2 + 1);
    local_30.m_at = local_d0.m_at;
    local_cc[0] = true;
    local_cc[1] = false;
    local_cc[2] = false;
    local_cc[3] = false;
    doctest::detail::Expression_lhs<int_const&>::operator==
              (&local_c8,(Expression_lhs<int_const&> *)&local_30,(int *)local_cc);
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_04);
    if (extraout_AL_04 != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar4 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar4) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x57,"cfg.vector().at( 0 ).custom_field().m_value == 300","","");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar1 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar6 = (pointer)((long)(cfg->m_vector).
                             super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)ptVar1);
    if (ptVar6 == (pointer)0x0) goto LAB_00110886;
    local_30.lhs = (QString *)&ptVar1->m_custom_field;
    local_30.m_at = local_d0.m_at;
    local_cc[0] = true;
    local_cc[1] = true;
    local_cc[2] = false;
    local_cc[3] = false;
    doctest::detail::Expression_lhs<int_const&>::operator==
              (&local_c8,(Expression_lhs<int_const&> *)&local_30,(int *)local_cc);
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_05);
    if (extraout_AL_05 != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar4 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar4) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x59,"cfg.vector().at( 0 ).bool_scalar().bool_scalar() == true","","");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar6 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = (long)(cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ptVar6;
    if (lVar5 == 0) goto LAB_001108a8;
    local_30.lhs = (QString *)&ptVar6->m_bool_scalar;
    local_30.m_at = local_d0.m_at;
    local_cc[0] = true;
    doctest::detail::Expression_lhs<bool_const&>::operator==
              (&local_c8,(Expression_lhs<bool_const&> *)&local_30,local_cc);
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_06);
    if (extraout_AL_06 != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar4 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar4) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x5a,"cfg.vector().at( 0 ).bool_scalar().string_field() == \"one\"","","");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar6 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = (long)(cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ptVar6;
    if (lVar5 == 0) goto LAB_001108ca;
    local_30.lhs = &(ptVar6->m_bool_scalar).m_string_field;
    local_30.m_at = local_d0.m_at;
    doctest::detail::Expression_lhs<const_QString_&>::operator==<char[4],_nullptr>
              (&local_c8,&local_30,(char (*) [4])"one");
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_07);
    if (extraout_AL_07 != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar4 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar4) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x5c,"cfg.vector().at( 0 ).int_scalar().int_scalar() == 100","","");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar6 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = (long)(cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ptVar6;
    if (lVar5 == 0) goto LAB_001108ec;
    local_30.lhs = (QString *)&ptVar6->m_int_scalar;
    local_30.m_at = local_d0.m_at;
    local_cc[0] = true;
    local_cc[1] = false;
    local_cc[2] = false;
    local_cc[3] = false;
    doctest::detail::Expression_lhs<int_const&>::operator==
              (&local_c8,(Expression_lhs<int_const&> *)&local_30,(int *)local_cc);
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_08);
    if (extraout_AL_08 != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar4 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar4) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x5d,"cfg.vector().at( 0 ).int_scalar().string_field() == \"one\\n\\\"\\r\\t\\\\\"",
               "","");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar6 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = (long)(cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ptVar6;
    if (lVar5 == 0) goto LAB_0011090e;
    local_30.lhs = &(ptVar6->m_int_scalar).m_string_field;
    local_30.m_at = local_d0.m_at;
    doctest::detail::Expression_lhs<const_QString_&>::operator==<char[9],_nullptr>
              (&local_c8,&local_30,(char (*) [9])"one\n\"\r\t\\");
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_09);
    if (extraout_AL_09 != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar4 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar4) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x5f,"cfg.vector().at( 0 ).string_scalar().string_scalar() == \"string\"","","");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar6 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = (long)(cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ptVar6;
    if (lVar5 == 0) goto LAB_00110930;
    local_30.lhs = &(ptVar6->m_string_scalar).m_string_scalar;
    local_30.m_at = local_d0.m_at;
    doctest::detail::Expression_lhs<const_QString_&>::operator==<char[7],_nullptr>
              (&local_c8,&local_30,(char (*) [7])"string");
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_10);
    if (extraout_AL_10 != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar4 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar4) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x60,"cfg.vector().at( 0 ).string_scalar().string_field().isEmpty()","","");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar6 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = (long)(cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ptVar6;
    if (lVar5 == 0) goto LAB_00110952;
    local_30.lhs = (QString *)
                   ((ulong)(*(qsizetype *)((long)&(ptVar6->m_string_scalar).m_string_field + 0x10)
                           == 0) | (ulong)local_d0.m_at << 0x20);
    doctest::detail::Expression_lhs::operator_cast_to_Result(&local_c8,(Expression_lhs *)&local_30);
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_11);
    if (extraout_AL_11 != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar4 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar4) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x62,"cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().size() == 3","",
               "");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar6 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = (long)(cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ptVar6;
    if (lVar5 == 0) goto LAB_00110974;
    local_30.lhs = (QString *)
                   ((long)*(pointer *)((long)&(ptVar6->m_int_scalar_vector).m_int_scalar_vector + 8)
                    - *(long *)&(ptVar6->m_int_scalar_vector).m_int_scalar_vector.
                                super__Vector_base<int,_std::allocator<int>_> >> 2);
    local_30.m_at = local_d0.m_at;
    local_cc[0] = true;
    local_cc[1] = false;
    local_cc[2] = false;
    local_cc[3] = false;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              (&local_c8,(Expression_lhs<unsigned_long_const> *)&local_30,(int *)local_cc);
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_12);
    if (extraout_AL_12 != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar4 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar4) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,99,"cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().at( 0 ) == 100","",
               "");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar6 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = (long)(cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ptVar6;
    if (lVar5 == 0) goto LAB_00110996;
    ptVar1 = *(pointer *)
              &(ptVar6->m_int_scalar_vector).m_int_scalar_vector.
               super__Vector_base<int,_std::allocator<int>_>;
    if (*(pointer *)((long)&(ptVar6->m_int_scalar_vector).m_int_scalar_vector + 8) == ptVar1) {
      lVar5 = 0;
      goto LAB_001109ac;
    }
    local_30.m_at = local_d0.m_at;
    local_cc[0] = true;
    local_cc[1] = false;
    local_cc[2] = false;
    local_cc[3] = false;
    local_30.lhs = &ptVar1->m_string_field;
    doctest::detail::Expression_lhs<int_const&>::operator==
              (&local_c8,(Expression_lhs<int_const&> *)&local_30,(int *)local_cc);
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_13);
    if (extraout_AL_13 != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar4 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar4) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,100,"cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().at( 1 ) == 200",""
               ,"");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar6 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = (long)(cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ptVar6;
    if (lVar5 == 0) goto LAB_001109bc;
    lVar5 = *(long *)&(ptVar6->m_int_scalar_vector).m_int_scalar_vector.
                      super__Vector_base<int,_std::allocator<int>_>;
    uVar7 = (long)*(pointer *)((long)&(ptVar6->m_int_scalar_vector).m_int_scalar_vector + 8) - lVar5
            >> 2;
    if (uVar7 < 2) {
      uVar8 = 1;
      goto LAB_001109d7;
    }
    local_30.lhs = (QString *)(lVar5 + 4);
    local_30.m_at = local_d0.m_at;
    local_cc[0] = true;
    local_cc[1] = false;
    local_cc[2] = false;
    local_cc[3] = false;
    doctest::detail::Expression_lhs<int_const&>::operator==
              (&local_c8,(Expression_lhs<int_const&> *)&local_30,(int *)local_cc);
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_14);
    if (extraout_AL_14 != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar4 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar4) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x65,"cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().at( 2 ) == 300",
               "","");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar6 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = (long)(cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ptVar6;
    if (lVar5 == 0) goto LAB_001109e5;
    lVar5 = *(long *)&(ptVar6->m_int_scalar_vector).m_int_scalar_vector.
                      super__Vector_base<int,_std::allocator<int>_>;
    uVar7 = (long)*(pointer *)((long)&(ptVar6->m_int_scalar_vector).m_int_scalar_vector + 8) - lVar5
            >> 2;
    if (uVar7 < 3) {
      uVar8 = 2;
      goto LAB_00110a00;
    }
    local_30.lhs = (QString *)(lVar5 + 8);
    local_30.m_at = local_d0.m_at;
    local_cc[0] = true;
    local_cc[1] = true;
    local_cc[2] = false;
    local_cc[3] = false;
    doctest::detail::Expression_lhs<int_const&>::operator==
              (&local_c8,(Expression_lhs<int_const&> *)&local_30,(int *)local_cc);
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_15);
    if (extraout_AL_15 != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar4 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar4) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x69,
               "cfg.vector().at( 0 ).int_scalar_vector().string_field() == \"StringStringStringStringStringStringStringString\" \"StringStringStringStringStringStringStringString\" \"StringStringStringString\""
               ,"","");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar1 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar6 = (pointer)((long)(cfg->m_vector).
                             super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)ptVar1);
    if (ptVar6 != (pointer)0x0) {
      local_30.lhs = &(ptVar1->m_int_scalar_vector).m_string_field;
      local_30.m_at = local_d0.m_at;
      doctest::detail::Expression_lhs<const_QString_&>::operator==<char[121],_nullptr>
                (&local_c8,&local_30,
                 (char (*) [121])
                 "StringStringStringStringStringStringStringStringStringStringStringStringStringStringStringStringStringStringStringString"
                );
      doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
      local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
      doctest::String::~String(&local_c8.m_decomp);
      doctest::detail::ResultBuilder::log(&local_a8,__x_16);
      if (extraout_AL_16 != '\0') {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      if (local_a8.super_AssertData.m_failed == true) {
        bVar4 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
        if (bVar4) {
          doctest::detail::throwException();
        }
      }
      doctest::String::~String(&local_a8.super_AssertData.m_decomp);
      doctest::String::~String(&local_a8.super_AssertData.m_exception);
      return;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
             ((long)ptVar6 >> 5) * 0x6db6db6db6db6db7);
LAB_00110a30:
  doctest::detail::throwException();
}

Assistant:

void check_config( const cfg::vector_t & cfg )
{
	REQUIRE( cfg.vector().size() == 1 );
	REQUIRE( cfg.vector().at( 0 ).string_field() == "one" );
	REQUIRE( cfg.vector().at( 0 ).no_value_field() == true );
	REQUIRE( cfg.vector().at( 0 ).int_field().size() == 2 );
	REQUIRE( cfg.vector().at( 0 ).int_field().at( 0 ) == 100 );
	REQUIRE( cfg.vector().at( 0 ).int_field().at( 1 ) == 200 );
	REQUIRE( cfg.vector().at( 0 ).custom_field().m_value == 300 );

	REQUIRE( cfg.vector().at( 0 ).bool_scalar().bool_scalar() == true );
	REQUIRE( cfg.vector().at( 0 ).bool_scalar().string_field() == "one" );

	REQUIRE( cfg.vector().at( 0 ).int_scalar().int_scalar() == 100 );
	REQUIRE( cfg.vector().at( 0 ).int_scalar().string_field() == "one\n\"\r\t\\" );

	REQUIRE( cfg.vector().at( 0 ).string_scalar().string_scalar() == "string" );
	REQUIRE( cfg.vector().at( 0 ).string_scalar().string_field().isEmpty() );

	REQUIRE( cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().size() == 3 );
	REQUIRE( cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().at( 0 ) == 100 );
	REQUIRE( cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().at( 1 ) == 200 );
	REQUIRE( cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().at( 2 ) == 300 );
	REQUIRE( cfg.vector().at( 0 ).int_scalar_vector().string_field() ==
		"StringStringStringStringStringStringStringString"
		"StringStringStringStringStringStringStringString"
		"StringStringStringString" );
}